

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp_common.c
# Opt level: O2

void vdpp_set_default_zme_param(zme_params *param)

{
  param->zme_bypass_en = 1;
  param->zme_dering_enable = 1;
  param->zme_dering_sen_0 = 0x10;
  param->zme_dering_sen_1 = 4;
  param->zme_dering_blend_alpha = 0x10;
  param->zme_dering_blend_beta = 0xd;
  param->zme_tap8_coeff = g_zme_tap8_coeff;
  param->zme_tap6_coeff = g_zme_tap6_coeff;
  return;
}

Assistant:

void vdpp_set_default_zme_param(struct zme_params* param)
{
    param->zme_bypass_en = 1;
    param->zme_dering_enable = 1;
    param->zme_dering_sen_0 = 16;
    param->zme_dering_sen_1 = 4;
    param->zme_dering_blend_alpha = 16;
    param->zme_dering_blend_beta = 13;
    param->zme_tap8_coeff = g_zme_tap8_coeff;
    param->zme_tap6_coeff = g_zme_tap6_coeff;
}